

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  
  uVar4 = this->abs_value;
  pcVar11 = *it + this->size;
  pcVar7 = pcVar11;
  if (uVar4 < 100) {
    if (9 < uVar4) {
      uVar4 = (ulong)(uint)((int)uVar4 * 2);
      pcVar7 = pcVar11 + -1;
      pcVar11[-1] = internal::basic_data<void>::DIGITS[uVar4 + 1];
      goto LAB_0011c9db;
    }
  }
  else {
    iVar8 = -1;
    uVar10 = 1;
    iVar5 = -2;
    uVar6 = 2;
    do {
      uVar3 = uVar4;
      uVar4 = uVar3 / 100;
      uVar1 = (ulong)(uint)(((int)uVar3 + (int)uVar4 * -100) * 2);
      pcVar7[-1] = internal::basic_data<void>::DIGITS[uVar1 + 1];
      lVar12 = -1;
      if ((int)(uVar10 / 3) * 3 + iVar8 == 0) {
        pcVar7[-2] = this->sep;
        lVar12 = -2;
      }
      pcVar7[lVar12 + -1] = internal::basic_data<void>::DIGITS[uVar1];
      if ((int)(uVar6 / 3) * 3 + iVar5 == 0) {
        pcVar7[lVar12 + -2] = this->sep;
        lVar12 = lVar12 + -2;
      }
      else {
        lVar12 = lVar12 + -1;
      }
      pcVar7 = pcVar7 + lVar12;
      iVar8 = iVar8 + -2;
      uVar9 = (int)uVar10 + 2;
      uVar10 = (ulong)uVar9;
      iVar5 = iVar5 + -2;
      uVar6 = (ulong)((int)uVar6 + 2);
    } while (9999 < uVar3);
    if (999 < uVar3) {
      uVar4 = (ulong)(uint)((int)uVar4 * 2);
      pcVar7[-1] = internal::basic_data<void>::DIGITS[uVar4 + 1];
      if (iVar8 + (uVar9 / 3) * 3 == 0) {
        pcVar7[-2] = this->sep;
        pcVar7 = pcVar7 + -2;
      }
      else {
        pcVar7 = pcVar7 + -1;
      }
LAB_0011c9db:
      bVar2 = internal::basic_data<void>::DIGITS[uVar4];
      goto LAB_0011c9e7;
    }
  }
  bVar2 = (byte)uVar4 | 0x30;
LAB_0011c9e7:
  pcVar7[-1] = bVar2;
  *it = pcVar11;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }